

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookmempool.h
# Opt level: O0

MemChunk * __thiscall
cookmem::MemPool<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void>::removeSmallChunkList
          (MemPool<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void> *this,BinIndexType binIndex
          )

{
  bool bVar1;
  int iVar2;
  CircularList<cookmem::MemPool<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void>::SmallMemChunk>
  *this_00;
  undefined4 extraout_var;
  char *__filename;
  SmallMemChunk *chunk;
  CircularList<cookmem::MemPool<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void>::SmallMemChunk>
  *freeList;
  BinIndexType binIndex_local;
  MemPool<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void> *this_local;
  
  __filename = (char *)(ulong)binIndex;
  this_00 = getSmallChunkList(this,binIndex);
  iVar2 = CircularList<cookmem::MemPool<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void>::SmallMemChunk>
          ::remove(this_00,__filename);
  bVar1 = CircularList<cookmem::MemPool<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void>::SmallMemChunk>
          ::isEmpty(this_00);
  if (bVar1) {
    clearSmallMap(this,binIndex);
  }
  return (MemChunk *)CONCAT44(extraout_var,iVar2);
}

Assistant:

inline MemChunk*
    removeSmallChunkList (BinIndexType binIndex)
    {
        CircularList<SmallMemChunk>& freeList = getSmallChunkList (binIndex);
        SmallMemChunk* chunk = freeList.remove();
        if (freeList.isEmpty ())
        {
            clearSmallMap (binIndex);
        }
        return chunk;
    }